

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dioextra.c
# Opt level: O2

void check_keen_vision(CHAR_DATA *ch,CHAR_DATA *victim)

{
  CHAR_DATA *ch_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  CHAR_DATA **ppCVar6;
  char buf [4608];
  
  ppCVar6 = &ch->in_room->people;
  while (ch_00 = *ppCVar6, ch_00 != (CHAR_DATA *)0x0) {
    if (ch_00 != victim && ch_00 != ch) {
      bVar1 = can_see(ch_00,ch);
      if (bVar1) {
        iVar2 = get_skill(ch_00,(int)gsn_keen_vision);
        if (iVar2 != 0) {
          iVar3 = number_percent();
          if (iVar3 < iVar2) {
            pcVar4 = pers(ch,ch_00);
            pcVar5 = pers(victim,ch_00);
            sprintf(buf,"You notice %s slipping into %s\'s inventory.\n\r",pcVar4,pcVar5);
            send_to_char(buf,ch_00);
            check_improve(ch_00,(int)gsn_keen_vision,true,1);
          }
        }
      }
    }
    ppCVar6 = &ch_00->next_in_room;
  }
  return;
}

Assistant:

void check_keen_vision(CHAR_DATA *ch, CHAR_DATA *victim)
{
	char buf[MAX_STRING_LENGTH];
	CHAR_DATA *gch;
	int chance;

	for (gch = ch->in_room->people; gch != nullptr; gch = gch->next_in_room)
	{
		if (gch == ch || gch == victim)
			continue;

		if (!can_see(gch, ch))
			continue;

		chance = get_skill(gch, gsn_keen_vision);
		if (chance == 0)
			continue;

		if (number_percent() < chance)
		{
			sprintf(buf, "You notice %s slipping into %s's inventory.\n\r", pers(ch, gch), pers(victim, gch));
			send_to_char(buf, gch);
			check_improve(gch, gsn_keen_vision, true, 1);
		}
	}
}